

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

bool __thiscall deqp::gls::DrawTestSpec::valid(DrawTestSpec *this)

{
  ApiType ctxType;
  DrawMethod DVar1;
  IndexType IVar2;
  uint uVar3;
  uint uVar4;
  uint6 uVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  pointer pAVar11;
  long lVar12;
  GLValue GVar13;
  
  uVar5 = *(uint6 *)(gls::(anonymous_namespace)::getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)
                     ::infos + (long)(int)this->drawMethod * 6);
  pAVar11 = (this->attribs).
            super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->attribs).
                 super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar11) / 0x28;
  ctxType.m_bits = (this->apiType).m_bits;
  uVar9 = 0;
  if (0 < (int)uVar7) {
    uVar9 = uVar7 & 0xffffffff;
  }
  lVar12 = uVar9 + 1;
  do {
    lVar12 = lVar12 + -1;
    if (lVar12 == 0) {
      if (((uint)uVar5 >> 0x10 & 1) != 0) {
        IVar2 = this->indexType;
        if (IVar2 == INDEXTYPE_INT) {
          GVar13 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_INT);
          uVar10 = GVar13.field_1._0_4_;
        }
        else if (IVar2 == INDEXTYPE_SHORT) {
          GVar13 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_SHORT);
          uVar10 = (uint)GVar13.field_1._0_2_;
        }
        else {
          uVar10 = 0;
          if (IVar2 == INDEXTYPE_BYTE) {
            GVar13 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_BYTE);
            uVar10 = (uint)GVar13.field_1._0_1_;
          }
        }
        uVar3 = this->indexMin;
        uVar4 = this->indexMax;
        if (((int)(uVar4 | uVar3) < 0 || (int)uVar4 < (int)uVar3) ||
           (uVar10 < uVar4 || uVar10 < uVar3)) break;
      }
      if (((((uint)uVar5 >> 0x18 & 1) == 0) || (-1 < this->first)) &&
         ((uVar10 = (this->apiType).m_bits, uVar10 != 2 ||
          (((DVar1 = this->drawMethod, DVar1 == DRAWMETHOD_DRAWELEMENTS ||
            (DVar1 == DRAWMETHOD_DRAWARRAYS)) &&
           ((DVar1 != DRAWMETHOD_DRAWELEMENTS || (this->indexType < INDEXTYPE_INT)))))))) {
        if ((uVar5 & 0x10000000000) == 0) goto LAB_014fbbd2;
        uVar7 = 0;
        if ((this->indirectOffset & 3) != 0) goto LAB_014fbc7e;
        pAVar11 = (this->attribs).
                  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = ((long)(this->attribs).
                       super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar11) / 0x28;
        uVar9 = uVar8 & 0xffffffff;
        if ((int)uVar8 < 1) {
          uVar9 = uVar7;
        }
        goto LAB_014fbcb0;
      }
      break;
    }
    bVar6 = AttributeSpec::valid(pAVar11,ctxType);
    pAVar11 = pAVar11 + 1;
  } while (bVar6);
LAB_014fbc7c:
  uVar7 = 0;
LAB_014fbc7e:
  return SUB81(uVar7,0);
LAB_014fbcb0:
  if (uVar9 * 0x28 - uVar7 == 0) goto LAB_014fbbd2;
  if (((&pAVar11->useDefaultAttribute)[uVar7] == false) &&
     (*(int *)((long)&pAVar11->storage + uVar7) == 0)) goto LAB_014fbc7c;
  uVar7 = uVar7 + 0x28;
  goto LAB_014fbcb0;
LAB_014fbbd2:
  if ((this->drawMethod == DRAWMETHOD_DRAWELEMENTS_INDIRECT) &&
     ((uVar7 = 0, this->indexPointerOffset % indexTypeSize::size[(int)this->indexType] != 0 ||
      (this->indexStorage != STORAGE_BUFFER)))) goto LAB_014fbc7e;
  if (((uVar10 & 0x300) != 0x100) || (((uVar5 & 1) == 0 || (this->indexStorage != STORAGE_USER)))) {
    uVar7 = 1;
    goto LAB_014fbc7e;
  }
  goto LAB_014fbc7c;
}

Assistant:

bool DrawTestSpec::valid (void) const
{
	DE_ASSERT(apiType.getProfile() != glu::PROFILE_LAST);
	DE_ASSERT(primitive != PRIMITIVE_LAST);
	DE_ASSERT(drawMethod != DRAWMETHOD_LAST);

	const MethodInfo methodInfo = getMethodInfo(drawMethod);

	for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
		if (!attribs[ndx].valid(apiType))
			return false;

	if (methodInfo.ranged)
	{
		deUint32 maxIndexValue = 0;
		if (indexType == INDEXTYPE_BYTE)
			maxIndexValue = GLValue::getMaxValue(INPUTTYPE_UNSIGNED_BYTE).ub.getValue();
		else if (indexType == INDEXTYPE_SHORT)
			maxIndexValue = GLValue::getMaxValue(INPUTTYPE_UNSIGNED_SHORT).us.getValue();
		else if (indexType == INDEXTYPE_INT)
			maxIndexValue = GLValue::getMaxValue(INPUTTYPE_UNSIGNED_INT).ui.getValue();
		else
			DE_ASSERT(DE_FALSE);

		if (indexMin > indexMax)
			return false;
		if (indexMin < 0 || indexMax < 0)
			return false;
		if ((deUint32)indexMin > maxIndexValue || (deUint32)indexMax > maxIndexValue)
			return false;
	}

	if (methodInfo.first && first < 0)
		return false;

	// GLES2 limits
	if (apiType == glu::ApiType::es(2,0))
	{
		if (drawMethod != gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS && drawMethod != gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS)
			return false;
		if (drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS && (indexType != INDEXTYPE_BYTE && indexType != INDEXTYPE_SHORT))
			return false;
	}

	// Indirect limitations
	if (methodInfo.indirect)
	{
		// Indirect offset alignment
		if (indirectOffset % 4 != 0)
			return false;

		// All attribute arrays must be stored in a buffer
		for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
			if (!attribs[ndx].useDefaultAttribute && attribs[ndx].storage == gls::DrawTestSpec::STORAGE_USER)
				return false;
	}
	if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INDIRECT)
	{
		// index offset must be convertable to firstIndex
		if (indexPointerOffset % gls::DrawTestSpec::indexTypeSize(indexType) != 0)
			return false;

		// Indices must be in a buffer
		if (indexStorage != STORAGE_BUFFER)
			return false;
	}

	// Do not allow user pointer in GL core
	if (apiType.getProfile() == glu::PROFILE_CORE)
	{
		if (methodInfo.indexed && indexStorage == DrawTestSpec::STORAGE_USER)
			return false;
	}

	return true;
}